

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyxml2.cpp
# Opt level: O3

XMLNode * __thiscall
tinyxml2::XMLNode::InsertAfterChild(XMLNode *this,XMLNode *afterThis,XMLNode *addThis)

{
  XMLNode *pXVar1;
  
  if ((addThis->_document == this->_document) && (afterThis->_parent == this)) {
    if (afterThis != addThis) {
      if (afterThis->_next == (XMLNode *)0x0) {
        pXVar1 = InsertEndChild(this,addThis);
        return pXVar1;
      }
      InsertChildPreamble(this,addThis);
      addThis->_prev = afterThis;
      pXVar1 = afterThis->_next;
      addThis->_next = pXVar1;
      pXVar1->_prev = addThis;
      afterThis->_next = addThis;
      addThis->_parent = this;
    }
  }
  else {
    addThis = (XMLNode *)0x0;
  }
  return addThis;
}

Assistant:

XMLNode* XMLNode::InsertAfterChild(XMLNode* afterThis, XMLNode* addThis)
{
    TIXMLASSERT(addThis);
    if (addThis->_document != _document) {
        TIXMLASSERT(false);
        return 0;
    }

    TIXMLASSERT(afterThis);

    if (afterThis->_parent != this) {
        TIXMLASSERT(false);
        return 0;
    }
    if (afterThis == addThis) {
        // Current state: BeforeThis -> AddThis -> OneAfterAddThis
        // Now AddThis must disappear from it's location and then
        // reappear between BeforeThis and OneAfterAddThis.
        // So just leave it where it is.
        return addThis;
    }

    if (afterThis->_next == 0) {
        // The last node or the only node.
        return InsertEndChild(addThis);
    }
    InsertChildPreamble(addThis);
    addThis->_prev = afterThis;
    addThis->_next = afterThis->_next;
    afterThis->_next->_prev = addThis;
    afterThis->_next = addThis;
    addThis->_parent = this;
    return addThis;
}